

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::Clear(CodeGeneratorResponse_File *this)

{
  uint32_t *puVar1;
  LogMessage *other;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  uint local_14;
  CodeGeneratorResponse_File *pCStack_10;
  uint32_t cached_has_bits;
  CodeGeneratorResponse_File *this_local;
  
  local_14 = 0;
  pCStack_10 = this;
  puVar1 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  local_14 = *puVar1;
  if ((local_14 & 0xf) != 0) {
    if ((local_14 & 1) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&this->name_);
    }
    if ((local_14 & 2) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&this->insertion_point_);
    }
    if ((local_14 & 4) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&this->content_);
    }
    if ((local_14 & 8) != 0) {
      local_51 = 0;
      if (this->generated_code_info_ == (GeneratedCodeInfo *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
                   ,0x3fd);
        local_51 = 1;
        other = internal::LogMessage::operator<<
                          (&local_50,"CHECK failed: generated_code_info_ != nullptr: ");
        internal::LogFinisher::operator=(local_65,other);
      }
      if ((local_51 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_50);
      }
      GeneratedCodeInfo::Clear(this->generated_code_info_);
    }
  }
  internal::HasBits<1UL>::Clear(&this->_has_bits_);
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

void CodeGeneratorResponse_File::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    if (cached_has_bits & 0x00000001u) {
      name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      insertion_point_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000004u) {
      content_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000008u) {
      GOOGLE_DCHECK(generated_code_info_ != nullptr);
      generated_code_info_->Clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}